

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFsym.c
# Opt level: O1

void * NFsym(void *ll,char *s)

{
  uint *puVar1;
  int iVar2;
  uint *puVar3;
  
  puVar3 = *(uint **)(*(long *)((long)ll + 0x88) + 8);
  puVar1 = *(uint **)(*(long *)((long)ll + 0x80) + 8);
  while( true ) {
    if (puVar1 <= puVar3) {
      return (void *)0x0;
    }
    iVar2 = strcmp((char *)((ulong)*puVar3 + (long)puVar1),s);
    if (iVar2 == 0) break;
    puVar3 = puVar3 + 6;
  }
  return (void *)(*ll + *(long *)(puVar3 + 2));
}

Assistant:

void *NFsym(void *ll, const char *s)
{
    struct NF_link_map *l = ll;
    Elf64_Sym *symtab = (void *)l->l_info[DT_SYMTAB]->d_un.d_ptr;
    const char *strtab = (void *)l->l_info[DT_STRTAB]->d_un.d_ptr;

    Elf64_Sym *curr_sym = symtab;
    //strtab is at higher address, so this can serve as a end point
    while ((void *)curr_sym < (void *)strtab)
    {
        Elf64_Word name = curr_sym->st_name;
        if (!strcmp(strtab + name, s))
        {
            //found it
            //FIXME: you may want to check if the symbol is valid. E.g., is it UND?
            //symbol table cannot be modified. All we have done is just finishing got at around 0x200100
            return (void *)(curr_sym->st_value + l->l_addr);
        }
        curr_sym++;
    }
    return NULL; //find nothing
}